

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

void __thiscall
Centaurus::LookaheadDFA<char>::print(LookaheadDFA<char> *this,wostream *os,wstring *graph_name)

{
  int iVar1;
  wostream *pwVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint local_30;
  uint local_2c;
  uint i_2;
  uint i_1;
  int i;
  int num_colors;
  wstring *graph_name_local;
  wostream *os_local;
  LookaheadDFA<char> *this_local;
  
  pwVar2 = std::operator<<(os,L"digraph ");
  pwVar2 = std::operator<<(pwVar2,(wstring *)graph_name);
  pwVar2 = std::operator<<(pwVar2,L" {");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(os,L"rankdir=\"LR\";");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  iVar1 = get_color_num(this);
  for (i_2 = 1; (int)i_2 <= iVar1; i_2 = i_2 + 1) {
    pwVar2 = std::operator<<(os,L"A");
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,i_2);
    std::operator<<(pwVar2,L" [ label=\"");
    std::wostream::operator<<(os,i_2);
    pwVar2 = std::operator<<(os,L"\", shape=doublecircle ];");
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  }
  local_2c = 0;
  while( true ) {
    sVar3 = std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::
            size(&(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states);
    if (sVar3 <= local_2c) break;
    pwVar2 = std::operator<<(os,L"S");
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,local_2c);
    std::operator<<(pwVar2,L" [ label=\"");
    (*(this->super_NFABase<Centaurus::LDFAState<char>_>)._vptr_NFABase[2])(this,os,(ulong)local_2c);
    pwVar2 = std::operator<<(os,L"\", shape=circle ];");
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    local_2c = local_2c + 1;
  }
  local_30 = 0;
  while( true ) {
    sVar3 = std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::
            size(&(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states);
    if (sVar3 <= local_30) break;
    pvVar4 = std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::
             operator[](&(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states,(ulong)local_30
                       );
    (*(pvVar4->
      super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      )._vptr_NFABaseState[2])(pvVar4,os,(ulong)local_30);
    local_30 = local_30 + 1;
  }
  pwVar2 = std::operator<<(os,L"}");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  return;
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const override
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

        int num_colors = get_color_num();

        for (int i = 1; i <= num_colors; i++)
        {
            os << L"A" << i << L" [ label=\"";
            os << i;
            os << L"\", shape=doublecircle ];" << std::endl;
        }

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}